

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator::GenerateFieldInfo
          (RepeatedImmutableEnumFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  uint32 number;
  
  WriteUInt32ToUtf16CharSequence(*(uint32 *)(this->descriptor_ + 0x44),output);
  number = GetExperimentalJavaFieldType(this->descriptor_);
  WriteUInt32ToUtf16CharSequence(number,output);
  google::protobuf::io::Printer::Print((map *)printer,(char *)&this->variables_);
  if (*(int *)(*(long *)(this->descriptor_ + 0x28) + 0x3c) == 3) {
    return;
  }
  PrintEnumVerifierLogic
            (printer,this->descriptor_,&this->variables_,"$type$",",\n",
             (this->context_->options_).enforce_lite);
  return;
}

Assistant:

void RepeatedImmutableEnumFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  printer->Print(variables_, "\"$name$_\",\n");
  if (!SupportUnknownEnumValue(descriptor_->file())) {
    PrintEnumVerifierLogic(printer, descriptor_, variables_,
                           /*var_name=*/"$type$",
                           /*terminating_string=*/",\n",
                           /*enforce_lite=*/context_->EnforceLite());
  }
}